

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_float_convert.cpp
# Opt level: O0

double local_float_convert::get_random_float<double,_1,75>(void)

{
  int iVar1;
  result_type_conflict2 rVar2;
  result_type rVar3;
  linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *__urng;
  mt19937 *__urng_00;
  ranlux24_base *__urng_01;
  result_type_conflict3 rVar4;
  double local_50;
  local_builtin_float_type_conflict f;
  bool is_neg;
  local_builtin_float_type_conflict a;
  local_builtin_float_type_conflict e10;
  result_type_conflict2 p10;
  
  if ((get_random_float<double,-1,75>()::dist_man == '\0') &&
     (iVar1 = __cxa_guard_acquire(&get_random_float<double,-1,75>()::dist_man), iVar1 != 0)) {
    std::uniform_real_distribution<double>::uniform_real_distribution
              (&get_random_float<double,_-1,_75>::dist_man,0.0,1.0);
    __cxa_guard_release(&get_random_float<double,-1,75>()::dist_man);
  }
  if ((get_random_float<double,-1,75>()::dist_sgn == '\0') &&
     (iVar1 = __cxa_guard_acquire(), iVar1 != 0)) {
    get_random_float<double,_-1,_75>::dist_sgn = unsigned_dist_maker<unsigned_int>(0,1);
    __cxa_guard_release(&get_random_float<double,-1,75>()::dist_sgn);
  }
  if ((get_random_float<double,-1,75>()::dist_e10 == '\0') &&
     (iVar1 = __cxa_guard_acquire(&get_random_float<double,-1,75>()::dist_e10), iVar1 != 0)) {
    get_random_float<double,_-1,_75>::dist_e10 = unsigned_dist_maker<int>(-1,0x4b);
    __cxa_guard_release(&get_random_float<double,-1,75>()::dist_e10);
  }
  __urng = engine_e10();
  rVar2 = std::uniform_int_distribution<int>::operator()
                    (&get_random_float<double,_-1,_75>::dist_e10,__urng);
  local_50 = pow(10.0,(double)rVar2);
  __urng_00 = engine_man();
  rVar4 = std::uniform_real_distribution<double>::operator()
                    (&get_random_float<double,_-1,_75>::dist_man,__urng_00);
  local_50 = rVar4 * local_50;
  __urng_01 = engine_sgn();
  rVar3 = std::uniform_int_distribution<unsigned_int>::operator()
                    (&get_random_float<double,_-1,_75>::dist_sgn,__urng_01);
  if (rVar3 != 0) {
    local_50 = -local_50;
  }
  return local_50;
}

Assistant:

auto get_random_float() -> FloatingPointType
  {
    using local_builtin_float_type = FloatingPointType;

    static std::uniform_real_distribution<local_builtin_float_type>
    dist_man
    (
      static_cast<local_builtin_float_type>(0.0F),
      static_cast<local_builtin_float_type>(1.0F)
    );

    static auto dist_sgn = unsigned_dist_maker(static_cast<unsigned>(UINT8_C(0)),
                                               static_cast<unsigned>(UINT8_C(1)));

    static auto dist_e10 = unsigned_dist_maker(LoExp10, HiExp10);

    using std::pow;

    const auto p10 = dist_e10(engine_e10());

    const local_builtin_float_type e10 = pow(static_cast<local_builtin_float_type>(10.0F),
                                             static_cast<local_builtin_float_type>(p10));

    const local_builtin_float_type a = dist_man(engine_man()) * e10;

    const bool is_neg = (dist_sgn(engine_sgn()) != 0);

    const local_builtin_float_type f = ((!is_neg) ? a : -a);

    return f;
  }